

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

Ses_Man_t *
Ses_ManAlloc(word *pTruth,int nVars,int nFunc,int nMaxDepth,int *pArrTimeProfile,int fMakeAIG,
            int nBTLimit,int fVerbose)

{
  word *pwVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Ses_Man_t *pSVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  word *pwVar12;
  int iVar;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  word wVar17;
  word local_58 [5];
  
  pSVar5 = (Ses_Man_t *)calloc(1,0x488);
  if (0 < nFunc) {
    iVar10 = 0;
    uVar11 = 0;
    uVar13 = 0;
    do {
      if ((pTruth[(int)((uint)uVar13 * 4)] & 1) != 0) {
        lVar16 = 0;
        do {
          pwVar12 = pTruth + iVar10 + lVar16;
          uVar2 = *(uint *)((long)pwVar12 + 4);
          wVar17 = pwVar12[1];
          uVar3 = *(uint *)((long)pwVar12 + 0xc);
          pwVar1 = pTruth + iVar10 + lVar16;
          *(uint *)pwVar1 = (uint)*pwVar12 ^ 0xffffffff;
          *(uint *)((long)pwVar1 + 4) = uVar2 ^ 0xffffffff;
          *(uint *)(pwVar1 + 1) = (uint)wVar17 ^ 0xffffffff;
          *(uint *)((long)pwVar1 + 0xc) = uVar3 ^ 0xffffffff;
          lVar16 = lVar16 + 2;
        } while (lVar16 != 4);
        uVar11 = uVar11 | 1 << ((uint)uVar13 & 0x1f);
        pSVar5->bSpecInv = uVar11;
      }
      uVar13 = uVar13 + 1;
      iVar10 = iVar10 + 4;
    } while (uVar13 != (uint)nFunc);
  }
  pSVar5->pSpec = pTruth;
  pSVar5->nSpecVars = nVars;
  pSVar5->nSpecFunc = nFunc;
  iVar10 = 1 << ((byte)nVars - 6 & 0x1f);
  if (nVars < 7) {
    iVar10 = 1;
  }
  pSVar5->nSpecWords = iVar10;
  pSVar5->nRows = ~(-1 << ((byte)nVars & 0x1f));
  piVar8 = (int *)0x0;
  if (nMaxDepth < 0) {
    pArrTimeProfile = piVar8;
  }
  pSVar5->nMaxDepth = nMaxDepth;
  pSVar5->pArrTimeProfile = pArrTimeProfile;
  iVar10 = 0;
  if (pArrTimeProfile != (int *)0x0) {
    iVar10 = Abc_NormalizeArrivalTimes(pArrTimeProfile,nVars,&pSVar5->nArrTimeMax);
  }
  pSVar5->nArrTimeDelta = iVar10;
  pSVar5->fMakeAIG = fMakeAIG;
  pSVar5->nBTLimit = nBTLimit;
  pSVar5->fVerbose = fVerbose;
  pSVar5->fVeryVerbose = 0;
  pSVar5->fExtractVerbose = 0;
  pSVar5->fSatVerbose = 0;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar6->pArray = piVar7;
  pSVar5->vPolar = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x10;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(0x40);
  pVVar6->pArray = piVar7;
  pSVar5->vAssump = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < nVars - 1U) {
    iVar10 = nVars;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar10;
  if (iVar10 != 0) {
    piVar8 = (int *)malloc((long)iVar10 << 2);
  }
  pVVar6->pArray = piVar8;
  pSVar5->vStairDecVars = pVVar6;
  pSVar5->nRandRowAssigns = nVars * 2;
  pSVar5->fKeepRowAssigns = 0;
  if (pSVar5->nSpecFunc == 1) {
    uVar11 = pSVar5->nSpecWords;
    if ((int)uVar11 < 0) {
      __assert_fail("nBits >= 0 && nBits <= nWords * 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                    ,0xc6,"void Abc_TtMask(word *, int, int)");
    }
    if ((ulong)uVar11 != 0) {
      uVar9 = (ulong)(uVar11 << 6);
      pwVar12 = local_58;
      uVar13 = 0;
      uVar15 = uVar9;
      do {
        uVar14 = uVar13 + 0x40;
        wVar17 = 0xffffffffffffffff;
        if (uVar9 < uVar14) {
          if (uVar13 < uVar9) {
            if (0x40 < uVar15) {
              __assert_fail("nBits >= 0 && nBits <= 64",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                            ,0xc2,"word Abc_Tt6Mask(int)");
            }
          }
          else {
            wVar17 = 0;
          }
        }
        *pwVar12 = wVar17;
        uVar15 = uVar15 - 0x40;
        pwVar12 = pwVar12 + 1;
        uVar13 = uVar14;
      } while ((ulong)uVar11 << 6 != uVar14);
    }
    iVar10 = pSVar5->nSpecVars;
    if (0 < iVar10) {
      pwVar12 = pSVar5->pSpec;
      iVar = 0;
      do {
        iVar4 = Abc_TtIsTopDecomposable(pwVar12,local_58,uVar11,iVar);
        if (iVar4 != 0) {
          pSVar5->pDecVars = pSVar5->pDecVars | 1 << ((byte)iVar & 0x1f);
        }
        iVar = iVar + 1;
      } while (iVar10 != iVar);
    }
  }
  srand(0xcafe);
  return pSVar5;
}

Assistant:

static inline Ses_Man_t * Ses_ManAlloc( word * pTruth, int nVars, int nFunc, int nMaxDepth, int * pArrTimeProfile, int fMakeAIG, int nBTLimit, int fVerbose )
{
    int h, i;

    Ses_Man_t * p = ABC_CALLOC( Ses_Man_t, 1 );
    p->pSat       = NULL;
    p->bSpecInv   = 0;
    for ( h = 0; h < nFunc; ++h )
        if ( pTruth[h << 2] & 1 )
        {
            for ( i = 0; i < 4; ++i )
                pTruth[(h << 2) + i] = ~pTruth[(h << 2) + i];
            p->bSpecInv |= ( 1 << h );
        }
    p->pSpec           = pTruth;
    p->nSpecVars       = nVars;
    p->nSpecFunc       = nFunc;
    p->nSpecWords      = Abc_TtWordNum( nVars );
    p->nRows           = ( 1 << nVars ) - 1;
    p->nMaxDepth       = nMaxDepth;
    p->pArrTimeProfile = nMaxDepth >= 0 ? pArrTimeProfile : NULL;
    if ( p->pArrTimeProfile )
        p->nArrTimeDelta = Abc_NormalizeArrivalTimes( p->pArrTimeProfile, nVars, &p->nArrTimeMax );
    else
        p->nArrTimeDelta = p->nArrTimeMax = 0;
    p->fMakeAIG        = fMakeAIG;
    p->nBTLimit        = nBTLimit;
    p->fVerbose        = fVerbose;
    p->fVeryVerbose    = 0;
    p->fExtractVerbose = 0;
    p->fSatVerbose     = 0;
    p->vPolar          = Vec_IntAlloc( 100 );
    p->vAssump         = Vec_IntAlloc( 10 );
    p->vStairDecVars   = Vec_IntAlloc( nVars );
    p->nRandRowAssigns = 2 * nVars;
    p->fKeepRowAssigns = 0;

    if ( p->nSpecFunc == 1 )
        Ses_ManComputeTopDec( p );

    srand( 0xCAFE );

    return p;
}